

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

char __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::GetCharacter(CordRepBtree *this,size_t offset)

{
  CordRep *this_00;
  uint uVar1;
  bool bVar2;
  Position PVar3;
  string_view sVar4;
  
  if (offset < (this->super_CordRep).length) {
    uVar1 = (uint)(this->super_CordRep).storage[0];
    while( true ) {
      PVar3 = IndexOf(this,offset);
      offset = PVar3.n;
      bVar2 = uVar1 == 0;
      uVar1 = uVar1 - 1;
      if (bVar2) break;
      this_00 = Edge(this,PVar3.index);
      this = CordRep::btree(this_00);
    }
    sVar4 = Data(this,PVar3.index);
    return sVar4._M_str[offset];
  }
  __assert_fail("offset < length",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                ,0x3ea,"char absl::cord_internal::CordRepBtree::GetCharacter(size_t) const");
}

Assistant:

char CordRepBtree::GetCharacter(size_t offset) const {
  assert(offset < length);
  const CordRepBtree* node = this;
  int height = node->height();
  for (;;) {
    Position front = node->IndexOf(offset);
    if (--height < 0) return node->Data(front.index)[front.n];
    offset = front.n;
    node = node->Edge(front.index)->btree();
  }
}